

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void window_size_suite::window_1(void)

{
  array<int,_1UL> *this;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  iterator begin;
  iterator end;
  reference piVar1;
  iterator second_begin;
  iterator second_end;
  iterator first_begin;
  iterator first_end;
  allocator<int> local_2ad;
  int local_2ac;
  iterator local_2a8;
  size_type local_2a0;
  undefined1 local_298 [8];
  vector<int,_std::allocator<int>_> expect_5;
  undefined4 local_278 [2];
  int *local_270;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_268;
  iterator local_260;
  iterator local_250;
  allocator<int> local_23d;
  int local_23c;
  iterator local_238;
  size_type local_230;
  undefined1 local_228 [8];
  vector<int,_std::allocator<int>_> expect_4;
  undefined4 local_208 [2];
  int *local_200;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1f8;
  iterator local_1f0;
  iterator local_1e0;
  allocator<int> local_1cd;
  int local_1cc;
  iterator local_1c8;
  size_type local_1c0;
  undefined1 local_1b8 [8];
  vector<int,_std::allocator<int>_> expect_3;
  undefined4 local_198 [2];
  int *local_190;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_188;
  iterator local_180;
  iterator local_170;
  allocator<int> local_15d;
  int local_15c;
  iterator local_158;
  size_type local_150;
  undefined1 local_148 [8];
  vector<int,_std::allocator<int>_> expect_2;
  undefined4 local_128 [2];
  int *local_120;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_118;
  iterator local_110;
  iterator local_100;
  allocator<int> local_ed;
  int local_ec;
  iterator local_e8;
  size_type local_e0;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> expect_1;
  undefined4 local_b8 [2];
  int *local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  iterator local_a0;
  iterator local_90;
  allocator<int> local_6d;
  int local_6c;
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> expect;
  undefined4 local_38 [2];
  undefined1 local_30 [8];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_1UL> array;
  
  span.member.next._4_4_ = 0;
  this = (array<int,_1UL> *)((long)&span.member.next + 4);
  begin = std::array<int,_1UL>::begin(this);
  end = std::array<int,_1UL>::end(this);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)local_30,begin,end);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_30,1);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_38[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ce,"void window_size_suite::window_1()",piVar1,local_38);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9cf,"void window_size_suite::window_1()",piVar1,
             &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_6c = 1;
  local_68 = &local_6c;
  local_60 = 1;
  std::allocator<int>::allocator(&local_6d);
  __l_04._M_len = local_60;
  __l_04._M_array = local_68;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,__l_04,&local_6d);
  std::allocator<int>::~allocator(&local_6d);
  local_90 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_a0 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_a8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_58);
  local_b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_58);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9d2,"void window_size_suite::window_1()",local_90,local_a0,local_a8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_b0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_30,2);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_b8[0] = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9d6,"void window_size_suite::window_1()",piVar1,local_b8);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9d7,"void window_size_suite::window_1()",piVar1,
             &expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  local_ec = 2;
  local_e8 = &local_ec;
  local_e0 = 1;
  std::allocator<int>::allocator(&local_ed);
  __l_03._M_len = local_e0;
  __l_03._M_array = local_e8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_d8,__l_03,&local_ed);
  std::allocator<int>::~allocator(&local_ed);
  local_100 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_110 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_118._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_d8);
  local_120 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_d8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9da,"void window_size_suite::window_1()",local_100,local_110,local_118,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_120);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d8);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_30,3);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_128[0] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9de,"void window_size_suite::window_1()",piVar1,local_128);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9df,"void window_size_suite::window_1()",piVar1,
             &expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  local_15c = 3;
  local_158 = &local_15c;
  local_150 = 1;
  std::allocator<int>::allocator(&local_15d);
  __l_02._M_len = local_150;
  __l_02._M_array = local_158;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_148,__l_02,&local_15d);
  std::allocator<int>::~allocator(&local_15d);
  local_170 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_180 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_188._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_148);
  local_190 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_148);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9e2,"void window_size_suite::window_1()",local_170,local_180,local_188,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_190);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_148);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_30,4);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_198[0] = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9e6,"void window_size_suite::window_1()",piVar1,local_198);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9e7,"void window_size_suite::window_1()",piVar1,
             &expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  local_1cc = 4;
  local_1c8 = &local_1cc;
  local_1c0 = 1;
  std::allocator<int>::allocator(&local_1cd);
  __l_01._M_len = local_1c0;
  __l_01._M_array = local_1c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1b8,__l_01,&local_1cd);
  std::allocator<int>::~allocator(&local_1cd);
  local_1e0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_1f0 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_1f8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_1b8);
  local_200 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_1b8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ea,"void window_size_suite::window_1()",local_1e0,local_1f0,local_1f8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_200);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1b8);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_30,5);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_208[0] = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ee,"void window_size_suite::window_1()",piVar1,local_208);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9ef,"void window_size_suite::window_1()",piVar1,
             &expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  local_23c = 5;
  local_238 = &local_23c;
  local_230 = 1;
  std::allocator<int>::allocator(&local_23d);
  __l_00._M_len = local_230;
  __l_00._M_array = local_238;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_228,__l_00,&local_23d);
  std::allocator<int>::~allocator(&local_23d);
  local_250 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_260 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_268._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_228);
  local_270 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_228);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9f2,"void window_size_suite::window_1()",local_250,local_260,local_268,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_270);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_228);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_30,6);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  local_278[0] = 6;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","6",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9f6,"void window_size_suite::window_1()",piVar1,local_278);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back
                     ((circular_view<int,_18446744073709551615UL> *)local_30);
  expect_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 6;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","6",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9f7,"void window_size_suite::window_1()",piVar1,
             &expect_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  local_2ac = 6;
  local_2a8 = &local_2ac;
  local_2a0 = 1;
  std::allocator<int>::allocator(&local_2ad);
  __l._M_len = local_2a0;
  __l._M_array = local_2a8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_298,__l,&local_2ad);
  std::allocator<int>::~allocator(&local_2ad);
  first_begin = vista::circular_view<int,_18446744073709551615UL>::begin
                          ((circular_view<int,_18446744073709551615UL> *)local_30);
  first_end = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_30);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_298);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_298);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x9fa,"void window_size_suite::window_1()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_298);
  return;
}

Assistant:

void window_1()
{
    std::array<int, 1> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(1);
    {
        BOOST_TEST_EQ(span.front(), 1);
        BOOST_TEST_EQ(span.back(), 1);
        std::vector<int> expect = { 1 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(2);
    {
        BOOST_TEST_EQ(span.front(), 2);
        BOOST_TEST_EQ(span.back(), 2);
        std::vector<int> expect = { 2 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(3);
    {
        BOOST_TEST_EQ(span.front(), 3);
        BOOST_TEST_EQ(span.back(), 3);
        std::vector<int> expect = { 3 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(4);
    {
        BOOST_TEST_EQ(span.front(), 4);
        BOOST_TEST_EQ(span.back(), 4);
        std::vector<int> expect = { 4 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(5);
    {
        BOOST_TEST_EQ(span.front(), 5);
        BOOST_TEST_EQ(span.back(), 5);
        std::vector<int> expect = { 5 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(6);
    {
        BOOST_TEST_EQ(span.front(), 6);
        BOOST_TEST_EQ(span.back(), 6);
        std::vector<int> expect = { 6 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}